

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O3

var __thiscall cs::runtime_type::parse_bind(runtime_type *this,token_base *a,var *b)

{
  proxy *ppVar1;
  char *__s1;
  _Map_pointer ppaVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined *puVar4;
  token_base **pptVar5;
  bool *pbVar6;
  runtime_error *prVar7;
  slot_type *in_RCX;
  proxy *ppVar8;
  ulong uVar9;
  proxy *ppVar10;
  ulong uVar11;
  ulong uVar12;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *a_00;
  long lVar13;
  long lVar14;
  undefined1 local_88 [32];
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *local_68;
  token_base *local_60;
  undefined1 local_58 [32];
  
  ppVar1 = (proxy *)(in_RCX->value).first._M_dataplus._M_p;
  local_60 = a;
  if (ppVar1 == (proxy *)0x0) {
    puVar4 = &void::typeinfo;
  }
  else {
    iVar3 = (*ppVar1->data->_vptr_baseHolder[2])();
    puVar4 = (undefined *)CONCAT44(extraout_var,iVar3);
  }
  __s1 = *(char **)(puVar4 + 8);
  if ((__s1 != "St5dequeIN7cs_impl3anyESaIS1_EE") &&
     ((*__s1 == '*' || (iVar3 = strcmp(__s1,"St5dequeIN7cs_impl3anyESaIS1_EE"), iVar3 != 0)))) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"Only support structured binding with array.","");
    runtime_error::runtime_error(prVar7,(string *)local_88);
    __cxa_throw(prVar7,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  local_58._8_8_ = in_RCX;
  local_58._16_8_ = this;
  local_68 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                       ((any *)&in_RCX->value);
  ppVar1 = b[0xb].mDat;
  ppVar8 = b[7].mDat;
  uVar9 = (ulong)((long)ppVar1 - (long)ppVar8) >> 3;
  lVar13 = (long)b[8].mDat - (long)b[9].mDat >> 3;
  ppVar10 = b[4].mDat;
  lVar14 = (long)b[6].mDat - (long)ppVar10 >> 3;
  ppaVar2 = (local_68->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  if (((uVar9 - 1) + (ulong)(ppVar1 == (proxy *)0x0)) * 0x40 + lVar13 + lVar14 !=
      ((long)(local_68->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Deque_impl_data._M_start._M_last -
       (long)(local_68->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Deque_impl_data._M_start._M_cur >> 3) +
      ((long)(local_68->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Deque_impl_data._M_finish._M_cur -
       (long)(local_68->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Deque_impl_data._M_finish._M_first >> 3) +
      ((((ulong)((long)ppaVar2 -
                (long)(local_68->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(ppaVar2 == (_Map_pointer)0x0)) * 0x40) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"Unmatched structured binding.","");
    runtime_error::runtime_error(prVar7,(string *)local_88);
    __cxa_throw(prVar7,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  if (((uVar9 - 1) + (ulong)(ppVar1 == (proxy *)0x0)) * 0x40 + lVar13 + lVar14 != 0) {
    lVar13 = 0;
    uVar9 = 0;
    do {
      uVar11 = ((long)ppVar10 - (long)b[5].mDat >> 3) + uVar9;
      if ((long)uVar11 < 0) {
        uVar12 = (long)uVar11 >> 6;
LAB_0025f7d1:
        pbVar6 = (bool *)((uVar11 + uVar12 * -0x40) * 8 + *(long *)(&ppVar8->is_rvalue + uVar12 * 8)
                         );
      }
      else {
        if (0x3f < uVar11) {
          uVar12 = uVar11 >> 6;
          goto LAB_0025f7d1;
        }
        pbVar6 = &ppVar10->is_rvalue + lVar13;
      }
      local_88._0_8_ = *(undefined8 *)pbVar6;
      pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_88);
      iVar3 = (*(*pptVar5)->_vptr_token_base[2])();
      if (iVar3 == 0xf) {
        uVar11 = ((long)b[4].mDat - (long)b[5].mDat >> 3) + uVar9;
        if ((long)uVar11 < 0) {
          uVar12 = (long)uVar11 >> 6;
LAB_0025f86c:
          pbVar6 = (bool *)((uVar11 + uVar12 * -0x40) * 8 +
                           *(long *)(&(b[7].mDat)->is_rvalue + uVar12 * 8));
        }
        else {
          if (0x3f < uVar11) {
            uVar12 = uVar11 >> 6;
            goto LAB_0025f86c;
          }
          pbVar6 = &(b[4].mDat)->is_rvalue + lVar13;
        }
        local_88._0_8_ = *(undefined8 *)pbVar6;
        pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_88);
        parse_bind((runtime_type *)&stack0xffffffffffffffc8,local_60,(var *)*pptVar5);
        cs_impl::any::recycle((any *)&stack0xffffffffffffffc8);
      }
      else {
        uVar11 = ((long)b[4].mDat - (long)b[5].mDat >> 3) + uVar9;
        if ((long)uVar11 < 0) {
          uVar12 = (long)uVar11 >> 6;
LAB_0025f8cf:
          pbVar6 = (bool *)((uVar11 + uVar12 * -0x40) * 8 +
                           *(long *)(&(b[7].mDat)->is_rvalue + uVar12 * 8));
        }
        else {
          if (0x3f < uVar11) {
            uVar12 = uVar11 >> 6;
            goto LAB_0025f8cf;
          }
          pbVar6 = &(b[4].mDat)->is_rvalue + lVar13;
        }
        local_88._0_8_ = *(undefined8 *)pbVar6;
        parse_expr((runtime_type *)local_58,(iterator *)local_60,SUB81(local_88,0));
        uVar11 = ((long)(local_68->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                        _M_impl.super__Deque_impl_data._M_start._M_cur -
                  (long)(local_68->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                        _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar9;
        if ((long)uVar11 < 0) {
          uVar11 = (long)uVar11 >> 6;
LAB_0025f97f:
          a_00 = (deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)(uVar11 << 6);
        }
        else {
          a_00 = local_68;
          if (0x3f < uVar11) {
            uVar11 = uVar11 >> 6;
            goto LAB_0025f97f;
          }
        }
        parse_asi((runtime_type *)(local_58 + 0x18),(var *)a_00,(var *)local_58);
        cs_impl::any::recycle((any *)(local_58 + 0x18));
        cs_impl::any::recycle((any *)local_58);
      }
      uVar9 = uVar9 + 1;
      ppVar8 = b[7].mDat;
      ppVar10 = b[4].mDat;
      lVar13 = lVar13 + 8;
    } while (uVar9 < ((long)b[6].mDat - (long)ppVar10 >> 3) +
                     ((long)b[8].mDat - (long)b[9].mDat >> 3) +
                     ((((ulong)((long)b[0xb].mDat - (long)ppVar8) >> 3) - 1) +
                     (ulong)(b[0xb].mDat == (proxy *)0x0)) * 0x40);
  }
  ppVar1 = (proxy *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_58._8_8_)->_M_dataplus)._M_p;
  if (ppVar1 != (proxy *)0x0) {
    ppVar1->refcount = ppVar1->refcount + 1;
  }
  (((map_t<std::string,_callable> *)local_58._16_8_)->
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  ).
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  .ctrl_ = (ctrl_t *)ppVar1;
  return (var)(proxy *)local_58._16_8_;
}

Assistant:

var runtime_type::parse_bind(token_base *a, const var &b)
	{
		if (b.type() != typeid(array))
			throw runtime_error("Only support structured binding with array.");
		auto &pl = static_cast<token_parallel *>(a)->get_parallel();
		auto &arr = b.const_val<array>();
		if (pl.size() != arr.size())
			throw runtime_error("Unmatched structured binding.");
		for (std::size_t i = 0; i < pl.size(); ++i) {
			if (pl[i].root().data()->get_type() == token_types::parallel)
				parse_bind(pl[i].root().data(), arr[i]);
			else
				parse_asi(parse_expr(pl[i].root()), arr[i]);
		}
		return b;
	}